

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGeometryUtil.cpp
# Opt level: O3

void cbtGeometryUtil::getVerticesFromPlaneEquations
               (cbtAlignedObjectArray<cbtVector3> *planeEquations,
               cbtAlignedObjectArray<cbtVector3> *verticesOut)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ulong uVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  bool bVar18;
  uint uVar19;
  cbtVector3 *pcVar20;
  long lVar21;
  int iVar22;
  ulong uVar23;
  cbtVector3 *pcVar24;
  cbtVector3 *pcVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  ulong local_68;
  long local_60;
  cbtVector3 local_58;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  iVar8 = planeEquations->m_size;
  uVar26 = (ulong)iVar8;
  if (0 < (long)uVar26) {
    auVar41 = ZEXT1664(_DAT_009d86b0);
    auVar42 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    local_48 = 0;
    local_60 = 2;
    local_68 = 1;
    do {
      uVar1 = local_48 + 1;
      if (uVar1 < uVar26) {
        pcVar25 = planeEquations->m_data + local_48;
        lVar21 = local_60;
        uVar23 = local_68;
        local_48 = uVar1;
        do {
          local_38 = uVar23 + 1;
          if ((int)local_38 < iVar8) {
            pcVar24 = planeEquations->m_data + uVar23;
            lVar27 = lVar21;
            local_40 = lVar21;
            do {
              pcVar20 = planeEquations->m_data;
              uVar1 = *(ulong *)(pcVar24->m_floats + 1);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = uVar1;
              fVar4 = pcVar24->m_floats[0];
              fVar5 = pcVar20[lVar27].m_floats[0];
              uVar23 = *(ulong *)(pcVar20[lVar27].m_floats + 1);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar23;
              auVar30 = auVar41._0_16_;
              auVar28 = vpermt2ps_avx512vl(auVar36,auVar30,ZEXT416((uint)fVar4));
              auVar32._0_4_ = (float)uVar23 * auVar28._0_4_;
              auVar32._4_4_ = (float)(uVar23 >> 0x20) * auVar28._4_4_;
              auVar32._8_4_ = auVar28._8_4_ * 0.0;
              auVar32._12_4_ = auVar28._12_4_ * 0.0;
              auVar29 = vpermt2ps_avx512vl(auVar39,auVar30,ZEXT416((uint)fVar5));
              auVar16 = vfmsub231ps_fma(auVar32,auVar36,auVar29);
              auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * (float)uVar1)),ZEXT416((uint)fVar4),
                                        auVar39);
              auVar32 = vmovshdup_avx(auVar16);
              fVar34 = auVar32._0_4_;
              auVar32 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar16,auVar16);
              auVar32 = vfmadd231ss_fma(auVar32,auVar31,auVar31);
              if (0.0001 < auVar32._0_4_) {
                uVar7 = *(ulong *)(pcVar25->m_floats + 1);
                auVar38._8_8_ = 0;
                auVar38._0_8_ = uVar7;
                fVar6 = pcVar25->m_floats[0];
                fVar37 = (float)uVar7;
                auVar33._0_4_ = fVar37 * auVar29._0_4_;
                auVar33._4_4_ = (float)(uVar7 >> 0x20) * auVar29._4_4_;
                auVar33._8_4_ = auVar29._8_4_ * 0.0;
                auVar33._12_4_ = auVar29._12_4_ * 0.0;
                auVar30 = vpermt2ps_avx512vl(auVar38,auVar30,ZEXT416((uint)fVar6));
                auVar29 = vfmsub231ps_fma(auVar33,auVar39,auVar30);
                auVar39 = vfmsub213ss_fma(ZEXT416((uint)fVar5),auVar38,
                                          ZEXT416((uint)(fVar6 * (float)uVar23)));
                fVar5 = auVar29._0_4_;
                auVar40._0_4_ = fVar5 * fVar5;
                fVar9 = auVar29._4_4_;
                auVar40._4_4_ = fVar9 * fVar9;
                fVar11 = auVar29._8_4_;
                auVar40._8_4_ = fVar11 * fVar11;
                fVar13 = auVar29._12_4_;
                auVar40._12_4_ = fVar13 * fVar13;
                auVar32 = vmovshdup_avx(auVar40);
                auVar32 = vfmadd231ss_fma(auVar32,auVar29,auVar29);
                auVar32 = vfmadd231ss_fma(auVar32,auVar39,auVar39);
                if (0.0001 < auVar32._0_4_) {
                  auVar29._0_4_ = auVar30._0_4_ * (float)uVar1;
                  auVar29._4_4_ = auVar30._4_4_ * (float)(uVar1 >> 0x20);
                  auVar29._8_4_ = auVar30._8_4_ * 0.0;
                  auVar29._12_4_ = auVar30._12_4_ * 0.0;
                  auVar28 = vfmsub213ps_fma(auVar28,auVar38,auVar29);
                  auVar29 = vfmsub231ss_fma(ZEXT416((uint)(fVar37 * fVar4)),ZEXT416((uint)fVar6),
                                            auVar36);
                  fVar4 = auVar28._0_4_;
                  auVar30._0_4_ = fVar4 * fVar4;
                  fVar10 = auVar28._4_4_;
                  auVar30._4_4_ = fVar10 * fVar10;
                  fVar12 = auVar28._8_4_;
                  auVar30._8_4_ = fVar12 * fVar12;
                  fVar14 = auVar28._12_4_;
                  auVar30._12_4_ = fVar14 * fVar14;
                  auVar32 = vmovshdup_avx(auVar30);
                  auVar32 = vfmadd231ss_fma(auVar32,auVar28,auVar28);
                  auVar32 = vfmadd231ss_fma(auVar32,auVar29,auVar29);
                  if (0.0001 < auVar32._0_4_) {
                    auVar28 = vfmadd213ss_fma(ZEXT416((uint)fVar6),auVar16,
                                              ZEXT416((uint)(fVar37 * fVar34)));
                    auVar32 = vmovshdup_avx(auVar38);
                    auVar28 = vfmadd213ss_fma(auVar32,auVar31,auVar28);
                    auVar32 = vandps_avx(auVar42._0_16_,auVar28);
                    if (1e-06 < auVar32._0_4_) {
                      fVar34 = pcVar25->m_floats[3];
                      fVar6 = pcVar20[lVar27].m_floats[3];
                      fVar35 = -1.0 / auVar28._0_4_;
                      fVar37 = pcVar24->m_floats[3];
                      fVar15 = auVar31._0_4_ * fVar34;
                      auVar31._0_4_ =
                           fVar35 * (fVar6 * fVar4 + fVar37 * fVar5 + auVar16._0_4_ * fVar34);
                      auVar31._4_4_ =
                           fVar35 * (fVar6 * fVar10 + fVar37 * fVar9 + auVar16._4_4_ * fVar34);
                      auVar31._8_4_ =
                           fVar35 * (fVar6 * fVar12 + fVar37 * fVar11 + auVar16._8_4_ * fVar34);
                      auVar31._12_4_ =
                           fVar35 * (fVar6 * fVar14 + fVar37 * fVar13 + auVar16._12_4_ * fVar34);
                      auVar32 = vinsertps_avx(auVar31,ZEXT416((uint)fVar15),0x28);
                      local_58.m_floats[3] = auVar32._12_4_;
                      local_58.m_floats._0_8_ = auVar32._0_8_;
                      local_58.m_floats[2] =
                           fVar35 * (fVar6 * auVar29._0_4_ + fVar37 * auVar39._0_4_ + fVar15);
                      bVar18 = isPointInsidePlanes(planeEquations,&local_58,0.01);
                      if (bVar18) {
                        uVar19 = verticesOut->m_size;
                        if (uVar19 == verticesOut->m_capacity) {
                          iVar22 = uVar19 * 2;
                          if (uVar19 == 0) {
                            iVar22 = 1;
                          }
                          if ((int)uVar19 < iVar22) {
                            if (iVar22 == 0) {
                              pcVar20 = (cbtVector3 *)0x0;
                            }
                            else {
                              pcVar20 = (cbtVector3 *)
                                        cbtAlignedAllocInternal((long)iVar22 << 4,0x10);
                              uVar19 = verticesOut->m_size;
                            }
                            if (0 < (int)uVar19) {
                              lVar21 = 0;
                              do {
                                puVar2 = (undefined8 *)
                                         ((long)verticesOut->m_data->m_floats + lVar21);
                                uVar17 = puVar2[1];
                                puVar3 = (undefined8 *)((long)pcVar20->m_floats + lVar21);
                                *puVar3 = *puVar2;
                                puVar3[1] = uVar17;
                                lVar21 = lVar21 + 0x10;
                              } while ((ulong)uVar19 << 4 != lVar21);
                            }
                            if ((verticesOut->m_data != (cbtVector3 *)0x0) &&
                               (verticesOut->m_ownsMemory == true)) {
                              cbtAlignedFreeInternal(verticesOut->m_data);
                            }
                            verticesOut->m_ownsMemory = true;
                            verticesOut->m_data = pcVar20;
                            verticesOut->m_capacity = iVar22;
                            uVar19 = verticesOut->m_size;
                          }
                        }
                        *&verticesOut->m_data[(int)uVar19].m_floats = local_58.m_floats;
                        verticesOut->m_size = verticesOut->m_size + 1;
                      }
                      auVar41 = ZEXT1664(_DAT_009d86b0);
                      auVar42 = ZEXT1664(CONCAT412(0x7fffffff,
                                                   CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                      lVar21 = local_40;
                    }
                  }
                }
              }
              lVar27 = lVar27 + 1;
            } while ((int)lVar27 < iVar8);
          }
          lVar21 = lVar21 + 1;
          uVar23 = local_38;
          uVar1 = local_48;
        } while (local_38 != uVar26);
      }
      local_48 = uVar1;
      local_60 = local_60 + 1;
      local_68 = local_68 + 1;
    } while (local_48 != uVar26);
  }
  return;
}

Assistant:

void cbtGeometryUtil::getVerticesFromPlaneEquations(const cbtAlignedObjectArray<cbtVector3>& planeEquations, cbtAlignedObjectArray<cbtVector3>& verticesOut)
{
	const int numbrushes = planeEquations.size();
	// brute force:
	for (int i = 0; i < numbrushes; i++)
	{
		const cbtVector3& N1 = planeEquations[i];

		for (int j = i + 1; j < numbrushes; j++)
		{
			const cbtVector3& N2 = planeEquations[j];

			for (int k = j + 1; k < numbrushes; k++)
			{
				const cbtVector3& N3 = planeEquations[k];

				cbtVector3 n2n3;
				n2n3 = N2.cross(N3);
				cbtVector3 n3n1;
				n3n1 = N3.cross(N1);
				cbtVector3 n1n2;
				n1n2 = N1.cross(N2);

				if ((n2n3.length2() > cbtScalar(0.0001)) &&
					(n3n1.length2() > cbtScalar(0.0001)) &&
					(n1n2.length2() > cbtScalar(0.0001)))
				{
					//point P out of 3 plane equations:

					//	d1 ( N2 * N3 ) + d2 ( N3 * N1 ) + d3 ( N1 * N2 )
					//P =  -------------------------------------------------------------------------
					//   N1 . ( N2 * N3 )

					cbtScalar quotient = (N1.dot(n2n3));
					if (cbtFabs(quotient) > cbtScalar(0.000001))
					{
						quotient = cbtScalar(-1.) / quotient;
						n2n3 *= N1[3];
						n3n1 *= N2[3];
						n1n2 *= N3[3];
						cbtVector3 potentialVertex = n2n3;
						potentialVertex += n3n1;
						potentialVertex += n1n2;
						potentialVertex *= quotient;

						//check if inside, and replace supportingVertexOut if needed
						if (isPointInsidePlanes(planeEquations, potentialVertex, cbtScalar(0.01)))
						{
							verticesOut.push_back(potentialVertex);
						}
					}
				}
			}
		}
	}
}